

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOCK5ConnectionMaker.cpp
# Opt level: O2

void __thiscall
SOCK5ConnectionMaker::fill_fd_set(SOCK5ConnectionMaker *this,fd_set *rdfds,fd_set *wrfds)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = this->client_sock_ / 0x40;
  uVar2 = 1L << ((byte)this->client_sock_ & 0x3f);
  if (this->firstStepCompleted == false) {
    rdfds->fds_bits[iVar1] = rdfds->fds_bits[iVar1] | uVar2;
    rdfds = wrfds;
  }
  else {
    wrfds->fds_bits[iVar1] = wrfds->fds_bits[iVar1] | uVar2;
    if (this->outputbuf_size != 0) {
      return;
    }
  }
  rdfds->fds_bits[iVar1] = rdfds->fds_bits[iVar1] | uVar2;
  return;
}

Assistant:

void SOCK5ConnectionMaker::fill_fd_set(fd_set &rdfds, fd_set &wrfds) {
    if (!firstStepCompleted) {
        FD_SET(client_sock_, &rdfds);
        FD_SET(client_sock_, &wrfds);
    } else {
        FD_SET(client_sock_, &wrfds);
        if (outputbuf_size == 0) {
            FD_SET(client_sock_, &rdfds);
        }
    }
}